

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O1

int __thiscall
QDateTimeParser::findDay
          (QDateTimeParser *this,QStringView str,int startDay,int sectionIndex,QString *usedDay,
          int *used)

{
  QString *array;
  int iVar1;
  SectionNode *pSVar2;
  int day;
  long in_FS_OFFSET;
  QLocale l;
  ShortVector<QString> daysOfWeek;
  QString local_1a8;
  QLocale local_190;
  undefined1 local_188 [336];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar2 = sectionNode(this,sectionIndex);
  if ((pSVar2->type & DaySectionMask) == NoSection) {
    findDay();
    iVar1 = -1;
  }
  else {
    iVar1 = pSVar2->count;
    local_190.d.d.ptr = (QSharedDataPointer<QLocalePrivate>)&DAT_aaaaaaaaaaaaaaaa;
    (*this->_vptr_QDateTimeParser[6])(&local_190,this);
    memset(local_188,0xaa,0x150);
    local_188._0_8_ = 0xd;
    local_188._8_8_ = 0;
    array = (QString *)(local_188 + 0x18);
    local_188._16_8_ = array;
    if (startDay < -5) {
      QVLABase<QString>::reallocate_impl
                ((QVLABase<QString> *)local_188,0xd,array,0,(ulong)(8 - startDay));
    }
    if (startDay < 8) {
      day = startDay;
      do {
        QLocale::dayName(&local_1a8,&local_190,day,(uint)(iVar1 != 4));
        QVLABase<QString>::emplace_back_impl<QString>
                  ((QVLABase<QString> *)local_188,0xd,array,&local_1a8);
        if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
          }
        }
        day = day + 1;
      } while (day != 8);
    }
    iVar1 = findTextEntry(str,(ShortVector<QString> *)local_188,usedDay,used);
    if (iVar1 < 0) {
      startDay = 0;
    }
    std::_Destroy_n_aux<false>::__destroy_n<QString*,long_long>
              ((QString *)local_188._16_8_,local_188._8_8_);
    if ((QString *)local_188._16_8_ != array) {
      QtPrivate::sizedFree((void *)local_188._16_8_,local_188._0_8_ * 0x18);
    }
    iVar1 = startDay + iVar1;
    QLocale::~QLocale(&local_190);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QDateTimeParser::findDay(QStringView str, int startDay, int sectionIndex, QString *usedDay, int *used) const
{
    const SectionNode &sn = sectionNode(sectionIndex);
    if (!(sn.type & DaySectionMask)) {
        qWarning("QDateTimeParser::findDay Internal error");
        return -1;
    }

    QLocale::FormatType type = sn.count == 4 ? QLocale::LongFormat : QLocale::ShortFormat;
    QLocale l = locale();
    ShortVector<QString> daysOfWeek;
    daysOfWeek.reserve(8 - startDay);
    for (int day = startDay; day <= 7; ++day)
        daysOfWeek.append(l.dayName(day, type));

    const int index = findTextEntry(str, daysOfWeek, usedDay, used);
    return index < 0 ? index : index + startDay;
}